

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O3

ON_String __thiscall ON_ErrorEvent::ToString(ON_ErrorEvent *this)

{
  byte bVar1;
  char *pcVar2;
  byte *in_RSI;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar4 = *(char **)(in_RSI + 0x10);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  pcVar5 = *(char **)(in_RSI + 0x18);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "";
  }
  pcVar2 = *(char **)(in_RSI + 8);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  bVar1 = *in_RSI;
  if (*pcVar4 == '\0') {
    if (bVar1 < 8) {
      pcVar4 = *(char **)(&DAT_0080f490 + (ulong)bVar1 * 8);
    }
    else {
      pcVar4 = "Invalid";
    }
    pcVar3 = "%s.%u: %s \"%s\"";
  }
  else {
    if (bVar1 < 8) {
      pcVar5 = *(char **)(&DAT_0080f490 + (ulong)bVar1 * 8);
    }
    else {
      pcVar5 = "Invalid";
    }
    pcVar3 = "%s.%u %s(): %s \"%s\"";
  }
  ON_String::FormatToString((char *)this,pcVar3,pcVar2,(ulong)*(uint *)(in_RSI + 4),pcVar4,pcVar5);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_ErrorEvent::ToString() const
{
  const char* function_name = FunctionName();
  const char* description = Description();
  if (0 != function_name[0])
  {
    return ON_String::FormatToString(
      "%s.%u %s(): %s \"%s\"",
      FileName(), 
      LineNumber(), 
      function_name,
      ON_ErrorEvent::TypeToString(m_event_type),
      description
    );
  }
  return ON_String::FormatToString(
    "%s.%u: %s \"%s\"",
    FileName(), 
    LineNumber(), 
    ON_ErrorEvent::TypeToString(m_event_type),
    description
  );
}